

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O3

int __thiscall CSound::Update(CSound *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->m_pConfig->m_SndVolume;
  iVar1 = (*(this->m_pGraphics->super_IGraphics).super_IInterface._vptr_IInterface[0x34])();
  if ((iVar1 == 0) && (this->m_pConfig->m_SndNonactiveMute != 0)) {
    iVar2 = 0;
  }
  if (iVar2 != m_SoundVolume) {
    lock_wait(m_SoundLock);
    m_SoundVolume = iVar2;
    lock_unlock(m_SoundLock);
  }
  return 0;
}

Assistant:

int CSound::Update()
{
	// update volume
	int WantedVolume = m_pConfig->m_SndVolume;

	if(!m_pGraphics->WindowActive() && m_pConfig->m_SndNonactiveMute)
		WantedVolume = 0;

	if(WantedVolume != m_SoundVolume)
	{
		lock_wait(m_SoundLock);
		m_SoundVolume = WantedVolume;
		lock_unlock(m_SoundLock);
	}

	return 0;
}